

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TwoStageDynamicBayesianNetwork.cpp
# Opt level: O1

void __thiscall
TwoStageDynamicBayesianNetwork::ScopeBackup
          (TwoStageDynamicBayesianNetwork *this,Scope *stateScope,Scope *agentScope,Scope *X,
          Scope *A)

{
  pointer puVar1;
  pointer pSVar2;
  ulong uVar3;
  ulong uVar4;
  uint *puVar5;
  Scope O;
  Scope Y;
  Scope local_60;
  Scope local_48;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_48.super_SDT,&stateScope->super_SDT);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_60.super_SDT,&agentScope->super_SDT);
  ComputeWithinNextStageClosure(this,&local_48,&local_60);
  puVar1 = (X->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((X->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (X->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  puVar1 = (A->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((A->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (A->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  puVar5 = local_48.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (local_48.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_48.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      uVar4 = (ulong)*puVar5;
      pSVar2 = (this->_m_XSoI_Y).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar3 = ((long)(this->_m_XSoI_Y).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pSVar2 >> 3) * -0x5555555555555555;
      if (uVar3 < uVar4 || uVar3 - uVar4 == 0) {
LAB_004895ac:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar4
                  );
      }
      Scope::Insert(X,pSVar2 + uVar4);
      pSVar2 = (this->_m_ASoI_Y).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar3 = ((long)(this->_m_ASoI_Y).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pSVar2 >> 3) * -0x5555555555555555;
      if (uVar3 < uVar4 || uVar3 - uVar4 == 0) goto LAB_004895ac;
      Scope::Insert(A,pSVar2 + uVar4);
      puVar5 = puVar5 + 1;
    } while (puVar5 != local_48.super_SDT.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  puVar5 = local_60.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (local_60.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_60.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      uVar4 = (ulong)*puVar5;
      pSVar2 = (this->_m_XSoI_O).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar3 = ((long)(this->_m_XSoI_O).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pSVar2 >> 3) * -0x5555555555555555;
      if (uVar3 < uVar4 || uVar3 - uVar4 == 0) {
LAB_004895bd:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      Scope::Insert(X,pSVar2 + uVar4);
      uVar4 = (ulong)*puVar5;
      pSVar2 = (this->_m_ASoI_O).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar3 = ((long)(this->_m_ASoI_O).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pSVar2 >> 3) * -0x5555555555555555;
      if (uVar3 < uVar4 || uVar3 - uVar4 == 0) goto LAB_004895bd;
      Scope::Insert(A,pSVar2 + uVar4);
      puVar5 = puVar5 + 1;
    } while (puVar5 != local_60.super_SDT.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  Scope::Sort(X);
  Scope::Sort(A);
  if (local_60.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint *)0x0) {
    operator_delete(local_60.super_SDT.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super_SDT.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super_SDT.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_48.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint *)0x0) {
    operator_delete(local_48.super_SDT.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super_SDT.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super_SDT.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void TwoStageDynamicBayesianNetwork::
ScopeBackup(    const Scope & stateScope, 
                const Scope & agentScope,
                Scope & X,
                Scope & A) const
{
    //first we compute the 'closure' of the NS state factors Y and
    //observations O. I.e., within stage connections can grow the set
    //of Y and O that need to be considered:
    Scope Y = stateScope;
    Scope O = agentScope;
    ComputeWithinNextStageClosure(Y,O);    

    X.clear();
    A.clear();
    //Next we do the backup of the Ys and Os
    for( Scope::iterator y_it = Y.begin(); y_it != Y.end(); y_it++)
    {
        Index yI = *y_it;
        X.Insert( _m_XSoI_Y.at(yI) );
        A.Insert( _m_ASoI_Y.at(yI) );
    }
    for( Scope::iterator o_it = O.begin(); o_it != O.end(); o_it++)
    {
        X.Insert( _m_XSoI_O.at(*o_it) );
        A.Insert( _m_ASoI_O.at(*o_it) );
    }
    X.Sort();
    A.Sort();
    return;
}